

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

void av1_restore_context(MACROBLOCK *x,RD_SEARCH_MACROBLOCK_CONTEXT *ctx,int mi_row,int mi_col,
                        BLOCK_SIZE bsize,int num_planes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  TXFM_CONTEXT *__dest;
  ulong __n;
  RD_SEARCH_MACROBLOCK_CONTEXT *__src;
  undefined3 in_register_00000081;
  ulong __n_00;
  ENTROPY_CONTEXT *__src_00;
  long lVar4;
  long lVar5;
  int tx_row;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [CONCAT31(in_register_00000081,bsize)];
  __n_00 = (ulong)bVar1;
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [CONCAT31(in_register_00000081,bsize)];
  __n = (ulong)bVar2;
  if (0 < num_planes) {
    __src_00 = ctx->l;
    lVar4 = 0;
    lVar5 = 0;
    __src = ctx;
    do {
      bVar3 = *(byte *)((long)(x->e_mbd).plane[0].pre + lVar4 * 4 + -0x2c);
      memcpy((void *)((long)(mi_col >> (bVar3 & 0x1f)) +
                     *(long *)((long)(x->e_mbd).above_entropy_context + lVar5)),__src,
             (ulong)(bVar1 >> (bVar3 & 0x3f)));
      bVar3 = *(byte *)((long)(x->e_mbd).plane[0].pre + lVar4 * 4 + -0x28);
      memcpy((x->e_mbd).left_entropy_context[0] +
             lVar5 * 4 + (ulong)((mi_row & 0x1fU) >> (bVar3 & 0x1f)),__src_00,
             (ulong)(bVar2 >> (bVar3 & 0x3f)));
      __src_00 = __src_00 + __n;
      __src = (RD_SEARCH_MACROBLOCK_CONTEXT *)(__src->a + __n_00);
      lVar5 = lVar5 + 8;
      lVar4 = lVar4 + 0x28c;
    } while ((ulong)(uint)num_planes << 3 != lVar5);
  }
  memcpy((x->e_mbd).above_partition_context + mi_col,ctx->sa,__n_00);
  memcpy((x->e_mbd).left_partition_context + (mi_row & 0x1f),ctx->sl,__n);
  __dest = ctx->p_ta;
  (x->e_mbd).above_txfm_context = __dest;
  (x->e_mbd).left_txfm_context = ctx->p_tl;
  memcpy(__dest,ctx->ta,__n_00);
  memcpy((x->e_mbd).left_txfm_context,ctx->tl,__n);
  return;
}

Assistant:

void av1_restore_context(MACROBLOCK *x, const RD_SEARCH_MACROBLOCK_CONTEXT *ctx,
                         int mi_row, int mi_col, BLOCK_SIZE bsize,
                         const int num_planes) {
  MACROBLOCKD *xd = &x->e_mbd;
  int p;
  const int num_4x4_blocks_wide = mi_size_wide[bsize];
  const int num_4x4_blocks_high = mi_size_high[bsize];
  int mi_width = mi_size_wide[bsize];
  int mi_height = mi_size_high[bsize];
  for (p = 0; p < num_planes; p++) {
    int tx_col = mi_col;
    int tx_row = mi_row & MAX_MIB_MASK;
    memcpy(
        xd->above_entropy_context[p] + (tx_col >> xd->plane[p].subsampling_x),
        ctx->a + num_4x4_blocks_wide * p,
        (sizeof(ENTROPY_CONTEXT) * num_4x4_blocks_wide) >>
            xd->plane[p].subsampling_x);
    memcpy(xd->left_entropy_context[p] + (tx_row >> xd->plane[p].subsampling_y),
           ctx->l + num_4x4_blocks_high * p,
           (sizeof(ENTROPY_CONTEXT) * num_4x4_blocks_high) >>
               xd->plane[p].subsampling_y);
  }
  memcpy(xd->above_partition_context + mi_col, ctx->sa,
         sizeof(*xd->above_partition_context) * mi_width);
  memcpy(xd->left_partition_context + (mi_row & MAX_MIB_MASK), ctx->sl,
         sizeof(xd->left_partition_context[0]) * mi_height);
  xd->above_txfm_context = ctx->p_ta;
  xd->left_txfm_context = ctx->p_tl;
  memcpy(xd->above_txfm_context, ctx->ta,
         sizeof(*xd->above_txfm_context) * mi_width);
  memcpy(xd->left_txfm_context, ctx->tl,
         sizeof(*xd->left_txfm_context) * mi_height);
}